

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::ContainsOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  ulong uVar1;
  undefined8 *puVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  anon_union_16_2_67f50693_for_value local_60;
  anon_union_16_2_67f50693_for_value local_50;
  idx_t local_40;
  bool *local_38;
  
  puVar3 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar8 = 8;
      iVar5 = 0;
      do {
        puVar2 = (undefined8 *)((long)ldata + lVar8 + -8);
        local_50._0_8_ = *puVar2;
        local_50.pointer.ptr = (char *)puVar2[1];
        puVar2 = (undefined8 *)((long)rdata + lVar8 + -8);
        local_60._0_8_ = *puVar2;
        local_60.pointer.ptr = (char *)puVar2[1];
        iVar6 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
        result_data[iVar5] = iVar6 != 0xffffffffffffffff;
        iVar5 = iVar5 + 1;
        lVar8 = lVar8 + 0x10;
      } while (count != iVar5);
    }
  }
  else {
    uVar1 = count + 0x3f;
    if (0x3f < uVar1) {
      uVar10 = 0;
      uVar7 = 0;
      local_40 = count;
      do {
        uVar12 = puVar3[uVar7];
        uVar13 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar13 = count;
        }
        uVar4 = uVar13;
        if (uVar12 != 0) {
          uVar4 = uVar10;
          if (uVar12 == 0xffffffffffffffff) {
            if (uVar10 < uVar13) {
              uVar12 = uVar10 << 4 | 8;
              do {
                puVar2 = (undefined8 *)((long)ldata + (uVar12 - 8));
                local_50._0_8_ = *puVar2;
                local_50.pointer.ptr = (char *)puVar2[1];
                puVar2 = (undefined8 *)((long)rdata + (uVar12 - 8));
                local_60._0_8_ = *puVar2;
                local_60.pointer.ptr = (char *)puVar2[1];
                iVar5 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
                result_data[uVar10] = iVar5 != 0xffffffffffffffff;
                uVar10 = uVar10 + 1;
                uVar12 = uVar12 + 0x10;
                uVar4 = uVar13;
              } while (uVar13 != uVar10);
            }
          }
          else if (uVar10 < uVar13) {
            local_38 = result_data + uVar10;
            uVar11 = uVar10 << 4 | 8;
            uVar9 = 0;
            do {
              if ((uVar12 >> (uVar9 & 0x3f) & 1) != 0) {
                puVar2 = (undefined8 *)((long)ldata + (uVar11 - 8));
                local_50._0_8_ = *puVar2;
                local_50.pointer.ptr = (char *)puVar2[1];
                puVar2 = (undefined8 *)((long)rdata + (uVar11 - 8));
                local_60._0_8_ = *puVar2;
                local_60.pointer.ptr = (char *)puVar2[1];
                iVar5 = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_60.pointer);
                local_38[uVar9] = iVar5 != 0xffffffffffffffff;
              }
              uVar9 = uVar9 + 1;
              uVar11 = uVar11 + 0x10;
              count = local_40;
              uVar4 = uVar13;
            } while (uVar13 - uVar10 != uVar9);
          }
        }
        uVar10 = uVar4;
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1 >> 6);
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}